

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pTVar1;
  int iVar2;
  CClosure *pCVar3;
  Value *pVVar4;
  CClosure *x_;
  TValue *io_1;
  TValue *io2;
  TValue *io1;
  CClosure *cl;
  TValue *io;
  int n_local;
  lua_CFunction fn_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x244,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
  }
  if (n == 0) {
    pTVar1 = L->top;
    (pTVar1->value_).f = fn;
    pTVar1->tt_ = 0x16;
    L->top = L->top + 1;
    if (L->ci->top < L->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x247,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
    }
LAB_00128934:
    iVar2 = **(int **)&L[-1].hookmask + -1;
    **(int **)&L[-1].hookmask = iVar2;
    if (iVar2 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x25a,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
    }
    return;
  }
  if ((long)L->top - (long)L->ci->func >> 4 <= (long)n) {
    __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x24b,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
  }
  if (0x7d < n) {
    luaG_runerror(L,"upvalue index too large");
  }
  if (0x7d < n) {
    __assert_fail("(n <= 125) && \"upvalue index too large\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x24e,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
  }
  pCVar3 = luaF_newCclosure(L,n);
  pCVar3->f = fn;
  L->top = L->top + -(long)n;
  io._4_4_ = n;
  do {
    do {
      do {
        iVar2 = io._4_4_ + -1;
        if (io._4_4_ == 0) {
          pTVar1 = L->top;
          if (9 < (pCVar3->tt & 0xf)) {
            __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x256,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
          }
          (pTVar1->value_).gc = (GCObject *)pCVar3;
          pTVar1->tt_ = 0x8026;
          if ((pTVar1->tt_ & 0x8000) != 0) {
            if ((pTVar1->tt_ & 0x8000) == 0) {
              __assert_fail("(((io)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x256,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
            }
            if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_001288ac:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x256,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
            }
            if (L != (lua_State *)0x0) {
              if ((pTVar1->tt_ & 0x8000) == 0) {
                __assert_fail("(((io)->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                              ,0x256,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
              }
              if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
              goto LAB_001288ac;
            }
          }
          L->top = L->top + 1;
          if (L->ci->top < L->top) {
            __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,599,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
          }
          if (0 < L->l_G->GCdebt) {
            luaC_step(L);
          }
          goto LAB_00128934;
        }
        pVVar4 = &pCVar3->upvalue[iVar2].value_;
        pTVar1 = L->top;
        *pVVar4 = pTVar1[iVar2].value_;
        *(LuaType *)(pVVar4 + 1) = pTVar1[iVar2].tt_;
        io._4_4_ = iVar2;
      } while (((ulong)pVVar4[1] & 0x8000) == 0);
      if (((ulong)pVVar4[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x253,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
      }
      if ((*(ushort *)(pVVar4 + 1) & 0x7f) != (ushort)pVVar4->gc->tt) goto LAB_00128768;
    } while (L == (lua_State *)0x0);
    if (((ulong)pVVar4[1] & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x253,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
    }
  } while ((pVVar4->gc->marked & (L->l_G->currentwhite ^ 0x18)) == 0);
LAB_00128768:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x253,"void lua_pushcclosure(lua_State *, lua_CFunction, int)");
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(L->top, fn);
    api_incr_top(L);
  }
  else {
    CClosure *cl;
    api_checknelems(L, n);
    if (n > MAXUPVAL)
      luaG_runerror(L, "upvalue index too large");
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    cl = luaF_newCclosure(L, n);
    cl->f = fn;
    L->top -= n;
    while (n--) {
      setobj2n(L, &cl->upvalue[n], L->top + n);
      /* does not need barrier because closure is white */
    }
    setclCvalue(L, L->top, cl);
    api_incr_top(L);
    luaC_checkGC(L);
  }
  lua_unlock(L);
}